

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireEmptyHandTest_tryPullOutNoCardsFromTableauPile_Test::TestBody
          (SolitaireEmptyHandTest_tryPullOutNoCardsFromTableauPile_Test *this)

{
  PileId *this_00;
  TableauPileMock *this_01;
  bool bVar1;
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_02;
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_03;
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_04;
  Solitaire *this_05;
  Cards *this_06;
  char *message;
  TableauPileMock *in_RSI;
  char *in_R9;
  string local_108;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_b8;
  ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  local_a0;
  Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  local_90;
  WithoutMatchers local_6d [13];
  Matcher<unsigned_int> local_60;
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  local_48;
  WithoutMatchers local_21;
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  local_20;
  SolitaireEmptyHandTest_tryPullOutNoCardsFromTableauPile_Test *local_10;
  SolitaireEmptyHandTest_tryPullOutNoCardsFromTableauPile_Test *this_local;
  
  local_10 = this;
  local_20.function_mocker_ =
       (FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
        *)piles::TableauPileMock::gmock_createSnapshot
                    ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                      *)(this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock
                     ,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
            ::operator()(&local_20,&local_21,(void *)0x0);
  testing::internal::
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::InternalExpectedAt
            (this_02,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x12d,"lastTableauPileMock","createSnapshot()");
  this_01 = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock;
  testing::Matcher<unsigned_int>::Matcher(&local_60,2);
  piles::TableauPileMock::gmock_tryPullOutCards(&local_48,this_01,&local_60);
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::
            MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
            ::operator()(&local_48,local_6d,(void *)0x0);
  this_04 = testing::internal::
            MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
            ::InternalExpectedAt
                      (this_03,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x12e,"lastTableauPileMock","tryPullOutCards(quantityToPullOut)");
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_b8,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::noCards);
  testing::Return<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            ((testing *)&local_a0,&local_b8);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_90,(ReturnAction *)&local_a0);
  testing::internal::
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::WillOnce(this_04,&local_90);
  testing::
  Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::~Action(&local_90);
  testing::internal::
  ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>::
  ~ReturnAction(&local_a0);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~vector(&local_b8);
  testing::internal::
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::~MockSpec(&local_48);
  testing::Matcher<unsigned_int>::~Matcher(&local_60);
  this_05 = &(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire;
  this_00 = (PileId *)
            ((long)&gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 4);
  piles::PileId::PileId(this_00,(PileId *)&(anonymous_namespace)::lastTableauPileId);
  Solitaire::tryPullOutCardsFromTableauPile(this_05,this_00,2);
  this_06 = Solitaire::getCardsInHand(this_05);
  local_d1 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                       (this_06);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,(internal *)local_d0,
               (AssertionResult *)"solitaire.getCardsInHand().empty()","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x132,message);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryPullOutNoCardsFromTableauPile) {
    EXPECT_CALL(lastTableauPileMock, createSnapshot());
    EXPECT_CALL(lastTableauPileMock, tryPullOutCards(quantityToPullOut))
        .WillOnce(Return(noCards));

    solitaire.tryPullOutCardsFromTableauPile(lastTableauPileId, quantityToPullOut);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}